

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreciseDeltaTests.cpp
# Opt level: O0

void __thiscall
agge::tests::PreciseDeltaTests::NegativeFractionalDeltaDoesNotOverflow(PreciseDeltaTests *this)

{
  int iVar1;
  bool local_151;
  bool local_131;
  allocator local_121;
  string local_120 [32];
  LocationInfo local_100;
  int local_d8;
  undefined1 local_d4 [4];
  int i_1;
  precise_delta d2;
  allocator local_b1;
  string local_b0 [32];
  LocationInfo local_90;
  int local_68;
  int local_64;
  int i;
  int sum;
  precise_delta d1;
  PreciseDeltaTests *this_local;
  int m;
  int exp;
  int iq;
  anon_union_4_2_0ec0eecc u;
  int m_1;
  int exp_1;
  int iq_1;
  anon_union_4_2_0ec0eecc u_1;
  
  i = 0;
  d1._quotient = 0x1e;
  sum = 0x3f5a;
  local_64 = 0;
  d1._8_8_ = this;
  precise_delta::multiply((precise_delta *)&i,-0x100);
  for (local_68 = 0x630000; local_68 != 0; local_68 = local_68 + -1) {
    iVar1 = precise_delta::next((precise_delta *)&i);
    local_64 = iVar1 + local_64;
  }
  local_131 = -0x6201 < local_64 && local_64 < -0x61fe;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PreciseDeltaTests.cpp"
             ,&local_b1);
  ut::LocationInfo::LocationInfo(&local_90,(string *)local_b0,0x46);
  ut::is_true(local_131,&local_90);
  ut::LocationInfo::~LocationInfo(&local_90);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  local_d4 = (undefined1  [4])0x0;
  d2._quotient = 0x1e;
  i_1 = -0x3f5a;
  local_64 = 0;
  precise_delta::multiply((precise_delta *)local_d4,0x100);
  for (local_d8 = 0x630000; local_d8 != 0; local_d8 = local_d8 + -1) {
    iVar1 = precise_delta::next((precise_delta *)local_d4);
    local_64 = iVar1 + local_64;
  }
  local_151 = -0x6201 < local_64 && local_64 < -0x61fe;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_120,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PreciseDeltaTests.cpp"
             ,&local_121);
  ut::LocationInfo::LocationInfo(&local_100,(string *)local_120,0x55);
  ut::is_true(local_151,&local_100);
  ut::LocationInfo::~LocationInfo(&local_100);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  return;
}

Assistant:

test( NegativeFractionalDeltaDoesNotOverflow )
			{
				// INIT
				precise_delta d1(98, 99 * 0x10000);
				int sum = 0;

				// ACT
				d1.multiply(-256);

				// ACT / ASSERT
				for (int i = 99 * 0x10000; i; --i)
					sum += d1.next();

				// ASSERT
				assert_is_true(-98 * 256 <= sum && sum <= -98 * 256 + 1);

				// INIT
				precise_delta d2(-98, 99 * 0x10000);

				sum = 0;

				// ACT
				d2.multiply(256);

				// ACT / ASSERT
				for (int i = 99 * 0x10000; i; --i)
					sum += d2.next();

				// ASSERT
				assert_is_true(-98 * 256 <= sum && sum <= -98 * 256 + 1);
			}